

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O0

string * __thiscall
CoreML::keyTypeToString_abi_cxx11_(string *__return_storage_ptr__,CoreML *this,KeyTypeCase tag)

{
  code *pcVar1;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  int local_14;
  string *psStack_10;
  KeyTypeCase tag_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Invalid",&local_26);
    std::allocator<char>::~allocator(&local_26);
  }
  else if (local_14 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Int64",&local_15);
    std::allocator<char>::~allocator(&local_15);
  }
  else {
    if (local_14 != 2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"String",local_25);
    std::allocator<char>::~allocator(local_25);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string keyTypeToString(Specification::DictionaryFeatureType::KeyTypeCase tag) {
        switch (tag) {
            case Specification::DictionaryFeatureType::kInt64KeyType:
                return "Int64";
            case Specification::DictionaryFeatureType::kStringKeyType:
                return "String";
            case Specification::DictionaryFeatureType::KEYTYPE_NOT_SET:
                return "Invalid";
        }
    }